

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

float ImGui::TableGetColumnWidthAuto(ImGuiTable *table,ImGuiTableColumn *column)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  
  uVar1 = -(uint)(column->ContentMaxXUnfrozen <= column->ContentMaxXFrozen);
  fVar3 = (float)(~uVar1 & (uint)column->ContentMaxXUnfrozen |
                 (uint)column->ContentMaxXFrozen & uVar1) - column->WorkMinX;
  uVar1 = column->Flags;
  if ((uVar1 >> 0xd & 1) == 0) {
    fVar4 = column->ContentMaxXHeadersIdeal - column->WorkMinX;
    uVar2 = -(uint)(fVar4 <= fVar3);
    fVar3 = (float)(uVar2 & (uint)fVar3 | ~uVar2 & (uint)fVar4);
  }
  if ((((uVar1 & 0x10) != 0) && (0.0 < column->InitStretchWeightOrWidth)) &&
     (((uVar1 & 0x20) != 0 || ((table->Flags & 1U) == 0)))) {
    fVar3 = column->InitStretchWeightOrWidth;
  }
  uVar1 = -(uint)(table->MinColumnWidth <= fVar3);
  return (float)(~uVar1 & (uint)table->MinColumnWidth | (uint)fVar3 & uVar1);
}

Assistant:

float ImGui::TableGetColumnWidthAuto(ImGuiTable* table, ImGuiTableColumn* column)
{
    const float content_width_body = ImMax(column->ContentMaxXFrozen, column->ContentMaxXUnfrozen) - column->WorkMinX;
    const float content_width_headers = column->ContentMaxXHeadersIdeal - column->WorkMinX;
    float width_auto = content_width_body;
    if (!(column->Flags & ImGuiTableColumnFlags_NoHeaderWidth))
        width_auto = ImMax(width_auto, content_width_headers);

    // Non-resizable fixed columns preserve their requested width
    if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f)
        if (!(table->Flags & ImGuiTableFlags_Resizable) || (column->Flags & ImGuiTableColumnFlags_NoResize))
            width_auto = column->InitStretchWeightOrWidth;

    return ImMax(width_auto, table->MinColumnWidth);
}